

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

ggml_tensor *
map_tensor(map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
           *tensor_map,ggml_context *ctx,ggml_tensor *tensor)

{
  bool bVar1;
  iterator tensor_00;
  mapped_type *ppgVar2;
  ggml_tensor *pgVar3;
  ggml_context *in_RDX;
  map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
  *in_RSI;
  map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
  *unaff_retaddr;
  int i_1;
  int i;
  ggml_tensor *new_tensor;
  ggml_tensor *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  _Self local_30;
  key_type *in_stack_fffffffffffffff8;
  mapped_type pgVar5;
  
  if (in_RDX == (ggml_context *)0x0) {
    pgVar5 = (mapped_type)0x0;
  }
  else {
    tensor_00 = std::
                map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                ::find((map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                        *)in_stack_ffffffffffffffb8,(key_type *)0x1684e8);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
         ::end((map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                *)in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,&local_30);
    if (bVar1) {
      ppgVar2 = std::
                map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                ::operator[](unaff_retaddr,in_stack_fffffffffffffff8);
      pgVar5 = *ppgVar2;
    }
    else {
      pgVar5 = ggml_dup_tensor((ggml_context *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8);
      pgVar3 = pgVar5;
      ppgVar2 = std::
                map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                ::operator[](unaff_retaddr,in_stack_fffffffffffffff8);
      *ppgVar2 = pgVar3;
      pgVar5->op = (ggml_op)in_RDX[2].mem_size;
      for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
        pgVar5->nb[iVar4] = (size_t)(&in_RDX[1].mem_buffer)[iVar4];
      }
      pgVar5->flags = *(int32_t *)((long)&in_RDX[3].objects_begin + 4);
      memcpy(pgVar5->op_params,(void *)((long)&in_RDX[2].mem_size + 4),0x40);
      strcpy(pgVar5->name,&in_RDX[6].mem_buffer_owned);
      pgVar5->data = in_RDX[6].mem_buffer;
      pgVar5->buffer = (ggml_backend_buffer *)in_RDX->mem_buffer;
      pgVar5->extra = (void *)in_RDX[8].mem_size;
      pgVar5->view_offs = in_RDX[6].mem_size;
      pgVar3 = map_tensor(in_RSI,in_RDX,(ggml_tensor *)tensor_00._M_node);
      pgVar5->view_src = pgVar3;
      for (iVar4 = 0; iVar4 < 10; iVar4 = iVar4 + 1) {
        pgVar3 = map_tensor(in_RSI,in_RDX,(ggml_tensor *)tensor_00._M_node);
        pgVar5->src[iVar4] = pgVar3;
      }
    }
  }
  return pgVar5;
}

Assistant:

static ggml_tensor * map_tensor(std::map<ggml_tensor *, ggml_tensor *> & tensor_map, ggml_context * ctx, ggml_tensor * tensor) {
    if (!tensor) {
        return nullptr;
    }

    if (tensor_map.find(tensor) != tensor_map.end()) {
        return tensor_map[tensor];
    }

    ggml_tensor * new_tensor = ggml_dup_tensor(ctx, tensor);
    tensor_map[tensor] = new_tensor;

    new_tensor->op = tensor->op;
    for (int i = 0; i < GGML_MAX_DIMS; i++) {
        new_tensor->nb[i] = tensor->nb[i];
    }
    new_tensor->flags = tensor->flags;
    memcpy(new_tensor->op_params, tensor->op_params, sizeof(tensor->op_params));
    strcpy(new_tensor->name, tensor->name);
    new_tensor->data = tensor->data;
    new_tensor->buffer = tensor->buffer;
    new_tensor->extra = tensor->extra;
    new_tensor->view_offs = tensor->view_offs;
    new_tensor->view_src = map_tensor(tensor_map, ctx, tensor->view_src);
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        new_tensor->src[i] = map_tensor(tensor_map, ctx, tensor->src[i]);
    }

    return new_tensor;
}